

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enumerate_tests.cpp
# Opt level: O0

void __thiscall omp_enumerate_moving_case_Test::TestBody(omp_enumerate_moving_case_Test *this)

{
  initializer_list<int> __l;
  bool bVar1;
  type *lhs;
  char *message;
  allocator<int> *this_00;
  AssertHelper local_118;
  Message local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar;
  int *value;
  type *idx;
  pair<const_long,_int_&> *local_d8;
  uint local_cc;
  undefined1 local_c8 [8];
  iterator __end1;
  iterator __begin1;
  enumerate<std::vector<int,_std::allocator<int>_>_> *__range1;
  allocator<int> local_69;
  int local_68 [12];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> expecting;
  omp_enumerate_moving_case_Test *this_local;
  
  local_68[8] = 8;
  local_68[9] = 9;
  local_68[4] = 4;
  local_68[5] = 5;
  local_68[6] = 6;
  local_68[7] = 7;
  local_68[0] = 0;
  local_68[1] = 1;
  local_68[2] = 2;
  local_68[3] = 3;
  local_38 = local_68;
  local_30 = 10;
  this_00 = &local_69;
  expecting.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::allocator<int>::allocator(this_00);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l,this_00);
  std::allocator<int>::~allocator(&local_69);
  omp::enumerate<std::vector<int,std::allocator<int>>>
            ((enumerate<std::vector<int,_std::allocator<int>_>_> *)&__begin1.value_,(omp *)local_28,
             (vector<int,_std::allocator<int>_> *)0x0,(ptrdiff_t)this_00);
  join_0x00000010_0x00000000_ =
       omp::details::enumerate<std::vector<int,_std::allocator<int>_>_>::begin
                 ((enumerate<std::vector<int,_std::allocator<int>_>_> *)&__begin1.value_);
  _local_c8 = omp::details::enumerate<std::vector<int,_std::allocator<int>_>_>::end
                        ((enumerate<std::vector<int,_std::allocator<int>_>_> *)&__begin1.value_);
  while (bVar1 = omp::details::
                 enumerate_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 ::operator!=((enumerate_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                               *)&__end1.value_,
                              (enumerate_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                               *)local_c8), bVar1) {
    _idx = omp::details::
           enumerate_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
           ::operator*((enumerate_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                        *)&__end1.value_);
    local_d8 = (pair<const_long,_int_&> *)&idx;
    lhs = std::get<0ul,long_const,int&>(local_d8);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )std::get<1ul,long_const,int&>(local_d8);
    testing::internal::EqHelper::Compare<long,_int,_nullptr>
              ((EqHelper *)local_108,"idx","value",lhs,
               (int *)gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_108);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/enumerate_tests.cpp"
                 ,0x87,message);
      testing::internal::AssertHelper::operator=(&local_118,&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      testing::Message::~Message(&local_110);
    }
    local_cc = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
    if (local_cc != 0) goto LAB_001213c0;
    omp::details::
    enumerate_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
    ::operator++((enumerate_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                  *)&__end1.value_);
  }
  local_cc = 2;
LAB_001213c0:
  omp::details::enumerate<std::vector<int,_std::allocator<int>_>_>::~enumerate
            ((enumerate<std::vector<int,_std::allocator<int>_>_> *)&__begin1.value_);
  if (local_cc == 2) {
    local_cc = 0;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

TEST(omp_enumerate, moving_case) {
  std::vector expecting = {0, 1, 2, 3, 4, 5, 6, 7, 8, 9};

  for (auto &[idx, value] : omp::enumerate(std::move(expecting)))
    ASSERT_EQ(idx, value);
}